

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O1

int mbedtls_ecdsa_sign(mbedtls_ecp_group *grp,mbedtls_mpi *r,mbedtls_mpi *s,mbedtls_mpi *d,
                      uchar *buf,size_t blen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *B;
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  mbedtls_mpi t;
  mbedtls_mpi e;
  mbedtls_mpi k;
  mbedtls_ecp_point R;
  mbedtls_mpi local_c0;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_90;
  mbedtls_ecp_point local_78;
  
  if ((grp->N).p == (mbedtls_mpi_uint *)0x0) {
    iVar1 = -0x4f80;
  }
  else {
    B = &grp->N;
    mbedtls_ecp_point_init(&local_78);
    mbedtls_mpi_init(&local_90);
    mbedtls_mpi_init(&local_a8);
    mbedtls_mpi_init(&local_c0);
    iVar4 = 0;
    while( true ) {
      iVar3 = 0xc;
      do {
        iVar1 = mbedtls_ecp_gen_keypair(grp,&local_90,&local_78,f_rng,p_rng);
        if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_mod_mpi(r,&local_78.X,B), iVar1 != 0))
        goto LAB_00124f9f;
        iVar3 = iVar3 + -1;
        iVar1 = -0x4d00;
        if (iVar3 == 0) goto LAB_00124f9f;
        iVar1 = mbedtls_mpi_cmp_int(r,0);
      } while (iVar1 == 0);
      iVar1 = derive_mpi(grp,&local_a8,buf,blen);
      if (iVar1 != 0) break;
      iVar3 = 0;
      do {
        uVar5 = grp->nbits + 7;
        iVar1 = mbedtls_mpi_fill_random(&local_c0,uVar5 >> 3,f_rng,p_rng);
        cVar2 = '\b';
        if ((iVar1 == 0) &&
           (iVar1 = mbedtls_mpi_shift_r(&local_c0,(uVar5 & 0xfffffffffffffff8) - grp->nbits),
           iVar1 == 0)) {
          cVar2 = 0x1d < iVar3;
          iVar1 = 0;
          iVar3 = iVar3 + 1;
        }
        if (cVar2 != '\0') {
          if (cVar2 != '\b') {
            return -0x4d00;
          }
          goto LAB_00124f9f;
        }
        iVar1 = mbedtls_mpi_cmp_int(&local_c0,1);
      } while ((iVar1 < 0) || (iVar1 = mbedtls_mpi_cmp_mpi(&local_c0,B), -1 < iVar1));
      iVar1 = mbedtls_mpi_mul_mpi(s,r,d);
      if (iVar1 != 0) break;
      iVar1 = mbedtls_mpi_add_mpi(&local_a8,&local_a8,s);
      if (iVar1 != 0) break;
      iVar1 = mbedtls_mpi_mul_mpi(&local_a8,&local_a8,&local_c0);
      if ((((iVar1 != 0) || (iVar1 = mbedtls_mpi_mul_mpi(&local_90,&local_90,&local_c0), iVar1 != 0)
           ) || (iVar1 = mbedtls_mpi_inv_mod(s,&local_90,B), iVar1 != 0)) ||
         (((iVar1 = mbedtls_mpi_mul_mpi(s,s,&local_a8), iVar1 != 0 ||
           (iVar1 = mbedtls_mpi_mod_mpi(s,s,B), iVar1 != 0)) || (iVar1 = -0x4d00, iVar4 == 0xb))))
      break;
      iVar4 = iVar4 + 1;
      iVar1 = 0;
      iVar3 = mbedtls_mpi_cmp_int(s,0);
      if (iVar3 != 0) break;
    }
LAB_00124f9f:
    mbedtls_ecp_point_free(&local_78);
    mbedtls_mpi_free(&local_90);
    mbedtls_mpi_free(&local_a8);
    mbedtls_mpi_free(&local_c0);
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_sign( mbedtls_ecp_group *grp, mbedtls_mpi *r, mbedtls_mpi *s,
                const mbedtls_mpi *d, const unsigned char *buf, size_t blen,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret, key_tries, sign_tries, blind_tries;
    mbedtls_ecp_point R;
    mbedtls_mpi k, e, t;

    /* Fail cleanly on curves such as Curve25519 that can't be used for ECDSA */
    if( grp->N.p == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    mbedtls_ecp_point_init( &R );
    mbedtls_mpi_init( &k ); mbedtls_mpi_init( &e ); mbedtls_mpi_init( &t );

    sign_tries = 0;
    do
    {
        /*
         * Steps 1-3: generate a suitable ephemeral keypair
         * and set r = xR mod n
         */
        key_tries = 0;
        do
        {
            MBEDTLS_MPI_CHK( mbedtls_ecp_gen_keypair( grp, &k, &R, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( r, &R.X, &grp->N ) );

            if( key_tries++ > 10 )
            {
                ret = MBEDTLS_ERR_ECP_RANDOM_FAILED;
                goto cleanup;
            }
        }
        while( mbedtls_mpi_cmp_int( r, 0 ) == 0 );

        /*
         * Step 5: derive MPI from hashed message
         */
        MBEDTLS_MPI_CHK( derive_mpi( grp, &e, buf, blen ) );

        /*
         * Generate a random value to blind inv_mod in next step,
         * avoiding a potential timing leak.
         */
        blind_tries = 0;
        do
        {
            size_t n_size = ( grp->nbits + 7 ) / 8;
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &t, n_size, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &t, 8 * n_size - grp->nbits ) );

            /* See mbedtls_ecp_gen_keypair() */
            if( ++blind_tries > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
        }
        while( mbedtls_mpi_cmp_int( &t, 1 ) < 0 ||
               mbedtls_mpi_cmp_mpi( &t, &grp->N ) >= 0 );

        /*
         * Step 6: compute s = (e + r * d) / k = t (e + rd) / (kt) mod n
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( s, r, d ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &e, &e, s ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &e, &e, &t ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &k, &k, &t ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( s, &k, &grp->N ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( s, s, &e ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( s, s, &grp->N ) );

        if( sign_tries++ > 10 )
        {
            ret = MBEDTLS_ERR_ECP_RANDOM_FAILED;
            goto cleanup;
        }
    }
    while( mbedtls_mpi_cmp_int( s, 0 ) == 0 );

cleanup:
    mbedtls_ecp_point_free( &R );
    mbedtls_mpi_free( &k ); mbedtls_mpi_free( &e ); mbedtls_mpi_free( &t );

    return( ret );
}